

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintexteditsearchwidget.cpp
# Opt level: O3

void __thiscall
QPlainTextEditSearchWidget::searchLineEditTextChanged
          (QPlainTextEditSearchWidget *this,QString *arg1)

{
  int iVar1;
  
  QString::operator=((QString *)(this + 0x70),(QString *)arg1);
  iVar1 = QTimer::interval();
  if ((iVar1 != 0) && (*(long *)(this + 0x80) != 0)) {
    QTimer::start();
    QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x48),0));
    QWidget::setEnabled(SUB81(*(undefined8 *)(*(long *)(this + 0x28) + 0x28),0));
    return;
  }
  performSearch(this);
  return;
}

Assistant:

void QPlainTextEditSearchWidget::searchLineEditTextChanged(
    const QString &arg1) {
    _searchTerm = arg1;

    if (_debounceTimer.interval() != 0 && !_searchTerm.isEmpty()) {
        _debounceTimer.start();
        ui->searchDownButton->setEnabled(false);
        ui->searchUpButton->setEnabled(false);
    } else {
        performSearch();
    }
}